

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediumAsteroid.cpp
# Opt level: O0

void __thiscall MediumAsteroid::spawn(MediumAsteroid *this)

{
  EVP_PKEY_CTX *in_RSI;
  SmallAsteroid *in_RDI;
  SmallAsteroid *sa;
  float da;
  float dy;
  float dx;
  int i;
  list<Entity_*,_std::allocator<Entity_*>_> *in_stack_ffffffffffffffd0;
  Asteroid *in_stack_ffffffffffffffe0;
  int local_c;
  
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    randf((float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
    randf((float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
    randf((float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
    rand();
    rand();
    rand();
    in_stack_ffffffffffffffe0 = (Asteroid *)operator_new(0x50);
    SmallAsteroid::SmallAsteroid(in_RDI);
    Asteroid::init(in_stack_ffffffffffffffe0,in_RSI);
    in_RSI = (EVP_PKEY_CTX *)&stack0xffffffffffffffc8;
    std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::push_back
              (in_stack_ffffffffffffffd0,(value_type *)in_stack_ffffffffffffffe0);
  }
  Entity::spawn(&in_stack_ffffffffffffffe0->super_Entity);
  return;
}

Assistant:

void MediumAsteroid::spawn(void)
{
   // Break into small fragments
   for (int i = 0; i < 3; i++) {
      float dx = randf(0.06f, 0.12f);
      float dy = randf(0.04f, 0.08f);
      float da = randf(0.001, 0.005);
      if (rand() % 2) dx = -dx;
      if (rand() % 2) dy = -dy;
      if (rand() % 2) da = -da;
      SmallAsteroid *sa = new SmallAsteroid();
      sa->init(x, y, dx, dy, da);
      new_entities.push_back(sa);
   }

   Entity::spawn();
}